

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EvaluationFunction.cpp
# Opt level: O1

void __thiscall imrt::EvaluationFunction::generate_Z(EvaluationFunction *this,Plan *p)

{
  int iVar1;
  pointer pvVar2;
  void *__s;
  void *pvVar3;
  Station *this_00;
  _List_node_base *p_Var4;
  long lVar5;
  _List_node_base *p_Var6;
  double dVar7;
  double dVar8;
  mapped_type *__x;
  Matrix *pMVar9;
  mapped_type *ppSVar10;
  pair<int,_int> pVar11;
  long lVar12;
  int angle;
  list<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> beamlets;
  key_type local_88;
  Plan *local_80;
  _Map_base<std::pair<int,_int>,_std::pair<const_std::pair<int,_int>,_std::__cxx11::list<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::__cxx11::list<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::pair<int,_int>_>,_imrt::pair_hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
  *local_78;
  long local_70;
  ulong local_68;
  long local_60;
  double local_58;
  double local_50;
  _List_node_base local_48;
  
  local_80 = p;
  Plan::get_stations_abi_cxx11_(p);
  iVar1 = this->nb_organs;
  if (0 < (long)iVar1) {
    pvVar2 = (this->Z).
             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    lVar12 = 0;
    do {
      __s = *(void **)((long)&(pvVar2->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                              super__Vector_impl_data + lVar12);
      pvVar3 = *(void **)((long)&(pvVar2->super__Vector_base<double,_std::allocator<double>_>).
                                 _M_impl.super__Vector_impl_data + lVar12 + 8);
      if (__s != pvVar3) {
        memset(__s,0,((long)pvVar3 + (-8 - (long)__s) & 0xfffffffffffffff8U) + 8);
      }
      lVar12 = lVar12 + 0x18;
    } while ((long)iVar1 * 0x18 != lVar12);
  }
  if (0 < this->nb_organs) {
    local_78 = (_Map_base<std::pair<int,_int>,_std::pair<const_std::pair<int,_int>,_std::__cxx11::list<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::__cxx11::list<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::pair<int,_int>_>,_imrt::pair_hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                *)&this->voxel2beamlet_list;
    local_80 = (Plan *)&local_80->angle2station;
    local_68 = 0;
    do {
      if (0 < (this->nb_voxels).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start[local_68]) {
        local_70 = local_68 * 3;
        local_60 = local_68 << 6;
        lVar12 = 0;
        do {
          local_88 = (key_type)(lVar12 << 0x20 | local_68);
          __x = std::__detail::
                _Map_base<std::pair<int,_int>,_std::pair<const_std::pair<int,_int>,_std::__cxx11::list<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::__cxx11::list<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::pair<int,_int>_>,_imrt::pair_hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                ::operator[](local_78,&local_88);
          std::__cxx11::list<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::list
                    ((list<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)&local_48,
                     __x);
          dVar8 = 0.0;
          dVar7 = local_50;
          for (p_Var4 = local_48._M_next; local_50 = dVar8, p_Var4 != &local_48;
              p_Var4 = (((_List_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
                        &p_Var4->_M_next)->_M_impl)._M_node.super__List_node_base._M_next) {
            iVar1 = *(int *)((long)&p_Var4[1]._M_next + 4);
            local_88.first = *(int *)&p_Var4[1]._M_next;
            pMVar9 = Volume::getDepositionMatrix
                               ((Volume *)
                                ((long)&((this->volumes->
                                         super__Vector_base<imrt::Volume,_std::allocator<imrt::Volume>_>
                                         )._M_impl.super__Vector_impl_data._M_start)->collimator +
                                local_60),*(int *)&p_Var4[1]._M_next);
            local_58 = pMVar9->p[lVar12][iVar1];
            ppSVar10 = std::
                       map<int,_imrt::Station_*,_std::less<int>,_std::allocator<std::pair<const_int,_imrt::Station_*>_>_>
                       ::at((map<int,_imrt::Station_*,_std::less<int>,_std::allocator<std::pair<const_int,_imrt::Station_*>_>_>
                             *)local_80,&local_88.first);
            this_00 = *ppSVar10;
            pVar11 = Station::getPos(this_00,iVar1);
            dVar8 = local_50 +
                    local_58 * (double)(int)(this_00->I).p[pVar11.first][(long)pVar11 >> 0x20];
            dVar7 = local_50;
          }
          lVar5 = *(long *)((long)&(((this->Z).
                                     super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start)->
                                   super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                                   super__Vector_impl_data + local_70 * 8);
          *(double *)(lVar5 + lVar12 * 8) = local_50 + *(double *)(lVar5 + lVar12 * 8);
          local_50 = dVar7;
          p_Var4 = local_48._M_next;
          while (p_Var4 != &local_48) {
            p_Var6 = p_Var4->_M_next;
            operator_delete(p_Var4);
            p_Var4 = p_Var6;
          }
          lVar12 = lVar12 + 1;
        } while (lVar12 < (this->nb_voxels).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start[local_68]);
      }
      local_68 = local_68 + 1;
    } while ((long)local_68 < (long)this->nb_organs);
  }
  return;
}

Assistant:

void EvaluationFunction::generate_Z(const Plan& p){
	const list<Station*>& stations=p.get_stations();

	for(int o=0; o<nb_organs; o++)
	 	 std::fill(Z[o].begin(), Z[o].end(), 0.0);

	//we update the dose distribution matrices Z with the dose delivered by the station
	for(int o=0; o<nb_organs; o++){
		 for(int k=0; k<nb_voxels[o]; k++){
		   double dose=0.0;
			 list<pair <int,int> > beamlets = voxel2beamlet_list[make_pair(o,k)];
			 for(auto bl:beamlets){
				 int angle=bl.first; int b=bl.second;
				 const Matrix&  Dep = volumes[o].getDepositionMatrix(angle);
				 dose += Dep(k,b)*p.angle2station.at(angle)->getIntensity(b);
			 }
		   Z[o][k] += dose;
		 }
	}
}